

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

GCproto * check_Lproto(lua_State *L,int nolua)

{
  TValue *pTVar1;
  TValue *o;
  int nolua_local;
  lua_State *L_local;
  
  pTVar1 = L->base;
  if (L->top <= pTVar1) {
LAB_001b6045:
    lj_err_argt(L,1,6);
  }
  if ((int)(pTVar1->field_4).it >> 0xf == -8) {
    L_local = (lua_State *)(pTVar1->u64 & 0x7fffffffffff);
  }
  else {
    if ((int)(pTVar1->field_4).it >> 0xf != -9) goto LAB_001b6045;
    if (*(char *)((pTVar1->u64 & 0x7fffffffffff) + 10) == '\0') {
      L_local = (lua_State *)(*(long *)((pTVar1->u64 & 0x7fffffffffff) + 0x20) + -0x68);
    }
    else {
      if (nolua == 0) goto LAB_001b6045;
      L_local = (lua_State *)0x0;
    }
  }
  return (GCproto *)L_local;
}

Assistant:

static GCproto *check_Lproto(lua_State *L, int nolua)
{
  TValue *o = L->base;
  if (L->top > o) {
    if (tvisproto(o)) {
      return protoV(o);
    } else if (tvisfunc(o)) {
      if (isluafunc(funcV(o)))
	return funcproto(funcV(o));
      else if (nolua)
	return NULL;
    }
  }
  lj_err_argt(L, 1, LUA_TFUNCTION);
  return NULL;  /* unreachable */
}